

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_eth.c
# Opt level: O0

void arp_print(void)

{
  int i;
  arp_list_entry_t *arp;
  int local_c;
  arp_list_entry_t *local_8;
  
  csp_print_func("ARP  CSP  MAC\n");
  for (local_8 = arp_list; local_8 != (arp_list_entry_t *)0x0; local_8 = local_8->next) {
    csp_print_func("     %3u  ",(ulong)local_8->csp_addr);
    for (local_c = 0; local_c < 6; local_c = local_c + 1) {
      csp_print_func("%02x ",(ulong)local_8->mac_addr[local_c]);
    }
  }
  csp_print_func("\n");
  return;
}

Assistant:

void arp_print()
{
    csp_print("ARP  CSP  MAC\n");
    for (arp_list_entry_t * arp = arp_list; arp; arp = arp->next) {
        csp_print("     %3u  ", (unsigned)(arp->csp_addr));
        for (int i = 0; i < CSP_ETH_ALEN; ++i) {
            csp_print("%02x ", arp->mac_addr[i]);
        }
    }
    csp_print("\n");
}